

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O0

void __thiscall
QtMWidgets::TextLabel::TextLabel(TextLabel *this,QString *text,QWidget *parent,WindowFlags f)

{
  TextLabelPrivate *this_00;
  TextLabelPrivate *this_01;
  QWidget *parent_local;
  QString *text_local;
  TextLabel *this_local;
  WindowFlags f_local;
  
  QFrame::QFrame(&this->super_QFrame,parent,(QFlags_conflict1 *)(ulong)f.i);
  *(undefined ***)this = &PTR_metaObject_002429e8;
  *(undefined ***)&this->field_0x10 = &PTR__TextLabel_00242ba0;
  this_00 = (TextLabelPrivate *)operator_new(0x28);
  TextLabelPrivate::TextLabelPrivate(this_00,this);
  QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
            ::operator->(&this->d);
  TextLabelPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  setText(this,text);
  return;
}

Assistant:

TextLabel::TextLabel( const QString & text,
	QWidget * parent, Qt::WindowFlags f )
	:	QFrame( parent, f )
	,	d( new TextLabelPrivate( this ) )
{
	d->init();
	setText( text );
}